

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int has_available_input_device(cubeb *ctx)

{
  int iVar1;
  uint32_t i;
  int r;
  int input_device_available;
  cubeb_device_collection devices;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar2;
  uint in_stack_ffffffffffffffd8;
  uint uVar3;
  undefined4 local_20;
  cubeb_device_type in_stack_ffffffffffffffe4;
  cubeb *in_stack_ffffffffffffffe8;
  uint local_4;
  
  uVar3 = 0;
  iVar1 = cubeb_enumerate_devices
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                     (cubeb_device_collection *)(ulong)in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    if (in_stack_ffffffffffffffe8 == (cubeb *)0x0) {
      fprintf(_stderr,"no input device available, skipping test.\n");
      cubeb_device_collection_destroy
                ((cubeb *)CONCAT44(uVar3,iVar1),
                 (cubeb_device_collection *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      local_4 = 0;
    }
    else {
      for (uVar2 = 0; (cubeb *)(ulong)uVar2 < in_stack_ffffffffffffffe8; uVar2 = uVar2 + 1) {
        uVar3 = *(int *)(CONCAT44(in_stack_ffffffffffffffe4,local_20) + (ulong)uVar2 * 0x58 + 0x2c)
                == 2 | uVar3;
      }
      if (uVar3 == 0) {
        fprintf(_stderr,"there are input devices, but they are not available, skipping\n");
      }
      cubeb_device_collection_destroy
                ((cubeb *)CONCAT44(uVar3,iVar1),
                 (cubeb_device_collection *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
      local_4 = (uint)(uVar3 != 0);
    }
  }
  else {
    fprintf(_stderr,"error enumerating devices.");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int has_available_input_device(cubeb * ctx)
{
  cubeb_device_collection devices;
  int input_device_available = 0;
  int r;
  /* Bail out early if the host does not have input devices. */
  r = cubeb_enumerate_devices(ctx, CUBEB_DEVICE_TYPE_INPUT, &devices);
  if (r != CUBEB_OK) {
    fprintf(stderr, "error enumerating devices.");
    return 0;
  }

  if (devices.count == 0) {
    fprintf(stderr, "no input device available, skipping test.\n");
    cubeb_device_collection_destroy(ctx, &devices);
    return 0;
  }

  for (uint32_t i = 0; i < devices.count; i++) {
    input_device_available |= (devices.device[i].state ==
                               CUBEB_DEVICE_STATE_ENABLED);
  }

  if (!input_device_available) {
    fprintf(stderr, "there are input devices, but they are not "
        "available, skipping\n");
  }

  cubeb_device_collection_destroy(ctx, &devices);
  return !!input_device_available;
}